

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  RenderContext *pRVar2;
  DrawTest *node;
  long *name;
  int iVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  uint uVar6;
  deUint32 dVar7;
  deBool dVar8;
  int iVar9;
  _Rb_tree_color _Var10;
  _Rb_tree_color _Var11;
  CompatibilityTestType CVar12;
  int extraout_EAX;
  long lVar13;
  uint *puVar14;
  _Base_ptr p_Var15;
  int iVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  ulong uVar19;
  undefined1 auVar20 [16];
  deUint32 hash;
  DrawTestSpec spec;
  UniformWeightArray<3> usageWeights;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  UniformWeightArray<7> primitiveWeights;
  UniformWeightArray<4> outputTypeWeights;
  UniformWeightArray<6> inputTypeWeights;
  AttributeSpec attribSpec;
  Random random;
  _Rb_tree_color local_304;
  undefined1 local_300 [56];
  pointer local_2c8;
  iterator local_2c0;
  AttributeSpec *local_2b8;
  DrawTest *local_2b0;
  TestNode *local_2a8;
  long local_2a0;
  float local_298 [2];
  long *local_290;
  long local_280 [2];
  RenderContext *local_270;
  TestContext *local_268;
  ulong local_260;
  float local_258 [8];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_238;
  float local_204 [12];
  float afStack_1d4 [7];
  AttributeSpec local_1b8 [2];
  ios_base local_148 [264];
  deRandom local_40;
  long lVar21;
  
  local_204[0] = 1.0;
  local_204[1] = 1.0;
  local_204[2] = 1.0;
  local_204[3] = 1.0;
  local_204[4] = 1.0;
  local_204[5] = 1.0;
  local_204[6] = 1.0;
  local_258[2] = 1.0;
  local_258[3] = 1.0;
  local_258[0] = 1.0;
  local_258[1] = 1.0;
  local_298[0] = 1.0;
  local_298[1] = 1.0;
  lVar13 = 1;
  auVar20 = _DAT_00632fe0;
  do {
    if (SUB164(auVar20 ^ _DAT_00625ae0,4) == -0x80000000 &&
        SUB164(auVar20 ^ _DAT_00625ae0,0) < -0x7ffffffa) {
      afStack_1d4[lVar13] = 1.0;
      afStack_1d4[lVar13 + 1] = 1.0;
    }
    lVar21 = auVar20._8_8_;
    auVar20._0_8_ = auVar20._0_8_ + 2;
    auVar20._8_8_ = lVar21 + 2;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 7);
  local_204[7] = 1.0;
  local_204[8] = 1.0;
  local_204[9] = 1.0;
  local_204[10] = 1.0;
  local_258[4] = 1.0;
  local_258[5] = 1.0;
  local_258[6] = 1.0;
  local_238._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_238._M_impl.super__Rb_tree_header._M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar19 = 0;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a0 = 0;
  local_2a8 = (TestNode *)this;
  local_238._M_impl.super__Rb_tree_header._M_header._M_right =
       local_238._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    deRandom_init(&local_40,(int)uVar19 + 0xc551393);
    uVar6 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&local_40,init::attribCounts,(int *)init::attribWeights,
                       init::attribWeights);
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_300);
    local_300._0_4_ = 2;
    local_300._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive_const*,float_const*>
                   ((Random *)&local_40,init::primitives,
                    (Primitive *)"N4deqp5gles210Functional12_GLOBAL__N_110FirstGroupE",local_204);
    local_300._8_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_40,init::primitiveCounts,(int *)init::primitiveCountWeights,
                    init::primitiveCountWeights);
    local_300._12_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod_const*,float_const*>
                   ((Random *)&local_40,init::drawMethods,
                    (DrawMethod *)"N4deqp5gles210Functional9DrawTestsE",local_258 + 2);
    local_300._16_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType_const*,float_const*>
                   ((Random *)&local_40,init::indexTypes,init::storages,local_258);
    local_300._20_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_40,init::indexOffsets,(int *)init::indexOffsetWeights,
                    init::indexOffsetWeights);
    local_300._24_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                   ((Random *)&local_40,init::storages,init::inputTypes,local_298);
    local_300._28_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_40,init::firsts,(int *)init::firstWeights,init::firstWeights);
    local_300._32_4_ = 0;
    local_300._36_4_ = 0;
    local_300._40_4_ = 0;
    bVar5 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_300);
    if (bVar5) {
      local_260 = uVar19;
      if (0 < (int)uVar6) {
        iVar16 = 0;
        do {
          deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec(local_1b8);
          local_1b8[0].inputType =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType_const*,float_const*>
                         ((Random *)&local_40,init::inputTypes,(InputType *)&DAT_0064fa88,
                          afStack_1d4 + 1);
          local_1b8[0].outputType =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType_const*,float_const*>
                         ((Random *)&local_40,init::outputTypes,init::usages,local_204 + 7);
          local_1b8[0].storage =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                         ((Random *)&local_40,init::storages,init::inputTypes,local_298);
          local_1b8[0].usage =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage_const*,float_const*>
                         ((Random *)&local_40,init::usages,init::blacklistedCases,local_258 + 4);
          dVar7 = deRandom_getUint32(&local_40);
          local_1b8[0].componentCount = (dVar7 & 3) + 1;
          local_1b8[0].offset =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_40,init::offsets,(int *)init::offsetWeights,
                          init::offsetWeights);
          local_1b8[0].stride =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_40,init::strides,(int *)init::strideWeights,
                          init::strideWeights);
          dVar8 = deRandom_getBool(&local_40);
          local_1b8[0].normalize = dVar8 == 1;
          local_1b8[0].instanceDivisor = 0;
          dVar8 = deRandom_getBool(&local_40);
          local_1b8[0].useDefaultAttribute = dVar8 == 1;
          bVar5 = deqp::gls::DrawTestSpec::AttributeSpec::valid(local_1b8,(ApiType)local_300._0_4_);
          iVar3 = local_1b8[0].componentCount;
          if (local_1b8[0].stride == 0) {
            if (bVar5) goto LAB_003c7175;
          }
          else {
            iVar9 = deqp::gls::DrawTestSpec::inputTypeSize(local_1b8[0].inputType);
            if (bVar5 && iVar9 * iVar3 <= local_1b8[0].stride) {
LAB_003c7175:
              if (local_2c0._M_current == local_2b8) {
                std::
                vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                ::_M_realloc_insert<deqp::gls::DrawTestSpec::AttributeSpec_const&>
                          ((vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                            *)&local_2c8,local_2c0,local_1b8);
              }
              else {
                (local_2c0._M_current)->instanceDivisor = local_1b8[0].instanceDivisor;
                (local_2c0._M_current)->useDefaultAttribute = (bool)(char)local_1b8[0]._36_4_;
                (local_2c0._M_current)->additionalPositionAttribute =
                     (bool)SUB41(local_1b8[0]._36_4_,1);
                (local_2c0._M_current)->bgraComponentOrder = (bool)SUB41(local_1b8[0]._36_4_,2);
                (local_2c0._M_current)->field_0x27 = SUB41(local_1b8[0]._36_4_,3);
                (local_2c0._M_current)->componentCount = local_1b8[0].componentCount;
                (local_2c0._M_current)->offset = local_1b8[0].offset;
                (local_2c0._M_current)->stride = local_1b8[0].stride;
                (local_2c0._M_current)->normalize = (bool)(char)local_1b8[0]._28_4_;
                *(int3 *)&(local_2c0._M_current)->field_0x1d = SUB43(local_1b8[0]._28_4_,1);
                (local_2c0._M_current)->inputType = local_1b8[0].inputType;
                (local_2c0._M_current)->outputType = local_1b8[0].outputType;
                (local_2c0._M_current)->storage = local_1b8[0].storage;
                (local_2c0._M_current)->usage = local_1b8[0].usage;
                local_2c0._M_current = local_2c0._M_current + 1;
              }
              iVar16 = iVar16 + 1;
            }
          }
        } while (iVar16 < (int)uVar6);
      }
      uVar19 = local_260;
      if (local_300._4_4_ != PRIMITIVE_POINTS) {
        local_2c8->instanceDivisor = 0;
      }
      if (((((local_300._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED) ||
            (local_300._4_4_ == PRIMITIVE_POINTS)) || (local_300._32_4_ != local_300._36_4_)) &&
          ((local_300._4_4_ == PRIMITIVE_POINTS || (local_2c8->useDefaultAttribute == false)))) &&
         ((2 < local_300._4_4_ - PRIMITIVE_TRIANGLES ||
          (((local_2c8->componentCount != 1 &&
            ((OUTPUTTYPE_UINT < local_2c8->outputType ||
             ((0x31U >> (local_2c8->outputType & 0x1f) & 1) == 0)))) &&
           ((local_300._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED ||
            (1 < (int)(local_300._36_4_ - local_300._32_4_))))))))) {
        _Var10 = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_300);
        if (0 < (int)uVar6) {
          lVar13 = 0;
          do {
            local_304 = _Var10;
            _Var11 = deqp::gls::DrawTestSpec::AttributeSpec::hash
                               ((AttributeSpec *)((long)&local_2c8->inputType + lVar13));
            _Var10 = _Var10 << 2 ^ _Var11;
            lVar13 = lVar13 + 0x28;
          } while ((ulong)uVar6 * 0x28 != lVar13);
        }
        local_304 = _Var10;
        if (local_238._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var4 = local_238._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var18 = &local_238._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var17 = p_Var18;
            p_Var15 = p_Var4;
            _Var11 = p_Var15[1]._M_color;
            p_Var18 = p_Var15;
            if (_Var11 < _Var10) {
              p_Var18 = p_Var17;
            }
            p_Var4 = (&p_Var15->_M_left)[_Var11 < _Var10];
          } while ((&p_Var15->_M_left)[_Var11 < _Var10] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var18 != &local_238._M_impl.super__Rb_tree_header) {
            if (_Var11 < _Var10) {
              p_Var15 = p_Var17;
            }
            if (p_Var15[1]._M_color <= _Var10) goto LAB_003c745a;
          }
        }
        puVar14 = std::
                  __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                            (init::blacklistedCases,&DAT_0064fab0,&local_304);
        if (puVar14 == (uint *)&DAT_0064fab0) {
          CVar12 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_300);
          if ((CVar12 != COMPATIBILITY_UNALIGNED_OFFSET) &&
             (CVar12 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_300),
             CVar12 != COMPATIBILITY_UNALIGNED_STRIDE)) {
            local_2b0 = (DrawTest *)operator_new(0x138);
            pTVar1 = local_2a8->m_testCtx;
            pRVar2 = ((Context *)local_2a8[1]._vptr_TestNode)->m_renderCtx;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            local_270 = pRVar2;
            local_268 = pTVar1;
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            name = local_290;
            deqp::gls::DrawTestSpec::getDesc_abi_cxx11_
                      ((string *)local_1b8,(DrawTestSpec *)local_300);
            node = local_2b0;
            deqp::gls::DrawTest::DrawTest
                      (local_2b0,local_268,local_270,(DrawTestSpec *)local_300,(char *)name,
                       (char *)CONCAT44(local_1b8[0].outputType,local_1b8[0].inputType));
            tcu::TestNode::addChild(local_2a8,(TestNode *)node);
            if ((int *)CONCAT44(local_1b8[0].outputType,local_1b8[0].inputType) !=
                &local_1b8[0].componentCount) {
              operator_delete((undefined1 *)CONCAT44(local_1b8[0].outputType,local_1b8[0].inputType)
                              ,CONCAT44(local_1b8[0].offset,local_1b8[0].componentCount) + 1);
            }
            if (local_290 != local_280) {
              operator_delete(local_290,local_280[0] + 1);
            }
          }
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_238,&local_304);
          local_2a0 = local_2a0 + 1;
        }
      }
    }
LAB_003c745a:
    if (local_2c8 != (pointer)0x0) {
      operator_delete(local_2c8,(long)local_2b8 - (long)local_2c8);
    }
    uVar6 = (int)uVar19 + 1;
    uVar19 = (ulong)uVar6;
    if (uVar6 == 100) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_238);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void RandomGroup::init (void)
{
	const int			numAttempts				= 100;

	static const int	attribCounts[]			= { 1, 2, 5 };
	static const float	attribWeights[]			= { 30, 10, 1 };
	static const int	primitiveCounts[]		= { 1, 5, 64 };
	static const float	primitiveCountWeights[]	= { 20, 10, 1 };
	static const int	indexOffsets[]			= { 0, 7, 13 };
	static const float	indexOffsetWeights[]	= { 20, 20, 1 };
	static const int	firsts[]				= { 0, 7, 13 };
	static const float	firstWeights[]			= { 20, 20, 1 };
	static const int	offsets[]				= { 0, 1, 5, 12 };
	static const float	offsetWeights[]			= { 50, 10, 10, 10 };
	static const int	strides[]				= { 0, 7, 16, 17 };
	static const float	strideWeights[]			= { 50, 10, 10, 10 };

	static const gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	static const gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	static const gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	static const gls::DrawTestSpec::Storage storages[] =
	{
		gls::DrawTestSpec::STORAGE_USER,
		gls::DrawTestSpec::STORAGE_BUFFER,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(storages)> storageWeights;

	static const gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	static const gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	static const gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	static const deUint32 blacklistedCases[]=
	{
		3153,	//!< extremely narrow triangle, results depend on sample positions
	};

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(2,0);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);
		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= 0;
		spec.indexMax				= 0;
		spec.instanceCount			= 0;

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= 0;
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end() &&
				!de::contains(DE_ARRAY_BEGIN(blacklistedCases), DE_ARRAY_END(blacklistedCases), hash))
			{
				// Only aligned cases
				if (spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET &&
					spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}